

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_tec_para_shard(REF_GRID ref_grid,char *root_filename)

{
  char local_428 [4];
  REF_STATUS ref_private_macro_code_rss;
  char filename [1024];
  REF_MPI ref_mpi;
  char *root_filename_local;
  REF_GRID ref_grid_local;
  
  filename._1016_8_ = ref_grid->mpi;
  if (((REF_MPI)filename._1016_8_)->n < 2) {
    snprintf(local_428,0x400,"%s.tec",root_filename);
  }
  else {
    snprintf(local_428,0x400,"%s_%04d_%04d.tec",root_filename,
             (ulong)(uint)((REF_MPI)filename._1016_8_)->n,
             (ulong)(uint)((REF_MPI)filename._1016_8_)->id);
  }
  ref_grid_local._4_4_ = ref_geom_tec(ref_grid,local_428);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe54,
           "ref_geom_tec_para_shard",(ulong)ref_grid_local._4_4_,"tec");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tec_para_shard(REF_GRID ref_grid,
                                           const char *root_filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  char filename[1024];
  if (ref_mpi_para(ref_mpi)) {
    snprintf(filename, 1024, "%s_%04d_%04d.tec", root_filename,
             ref_mpi_n(ref_mpi), ref_mpi_rank(ref_mpi));
  } else {
    snprintf(filename, 1024, "%s.tec", root_filename);
  }
  RSS(ref_geom_tec(ref_grid, filename), "tec");
  return REF_SUCCESS;
}